

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscanf.c
# Opt level: O0

int main(void)

{
  uint uVar1;
  int iVar2;
  int actual_rc_34;
  int actual_rc_33;
  int actual_rc_32;
  int actual_rc_31;
  int actual_rc_30;
  int actual_rc_29;
  int actual_rc_28;
  int actual_rc_27;
  int actual_rc_26;
  int actual_rc_25;
  int actual_rc_24;
  int actual_rc_23;
  int actual_rc_22;
  int actual_rc_21;
  int actual_rc_20;
  int actual_rc_19;
  int actual_rc_18;
  int actual_rc_17;
  int actual_rc_16;
  int actual_rc_15;
  int actual_rc_14;
  int actual_rc_13;
  int actual_rc_12;
  int actual_rc_11;
  int actual_rc_10;
  int actual_rc_9;
  int actual_rc_8;
  int actual_rc_7;
  int actual_rc_6;
  int actual_rc_5;
  int actual_rc_4;
  int actual_rc_3;
  int actual_rc_2;
  int actual_rc_1;
  int actual_rc;
  int n;
  int *p;
  uint u;
  int i;
  char buffer [100];
  char local_78 [8];
  char source [100];
  
  builtin_strncpy(local_78,"foo",4);
  uVar1 = sscanf(local_78,"%3c",&u);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0xb,1,(ulong)uVar1);
  }
  iVar2 = memcmp(&u,"foo",3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0xc,"memcmp( buffer, \"foo\", 3 ) == 0");
  }
  local_78[0] = '%';
  local_78[1] = 'x';
  local_78[2] = '\0';
  uVar1 = sscanf(local_78,"%%%c%n",&u,&actual_rc_1);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0xf,1,(ulong)uVar1);
  }
  if (actual_rc_1 != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x10,"n == 2");
  }
  if ((char)u != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x11,"buffer[0] == \'x\'");
  }
  builtin_strncpy(local_78,"abcdefg",8);
  uVar1 = sscanf(local_78,"%*[cba]%n",&actual_rc_1);
  if (uVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x13,0,(ulong)uVar1);
  }
  if (actual_rc_1 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x14,"n == 3");
  }
  builtin_strncpy(local_78,"foo",4);
  uVar1 = sscanf(local_78,"%*s%n",&actual_rc_1);
  if (uVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x15,0,(ulong)uVar1);
  }
  if (actual_rc_1 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x16,"n == 3");
  }
  builtin_strncpy(local_78,"abc",4);
  uVar1 = sscanf(local_78,"%*c%n",&actual_rc_1);
  if (uVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x17,0,(ulong)uVar1);
  }
  if (actual_rc_1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x18,"n == 1");
  }
  builtin_strncpy(local_78,"3xfoo",6);
  uVar1 = sscanf(local_78,"%*dx%3c",&u);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x19,1,(ulong)uVar1);
  }
  iVar2 = memcmp(&u,"foo",3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x1a,"memcmp( buffer, \"foo\", 3 ) == 0");
  }
  builtin_strncpy(local_78,"-2147483",8);
  builtin_strncpy(source,"648",4);
  uVar1 = sscanf(local_78,"%d",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x1d,1,(ulong)uVar1);
  }
  if (p._4_4_ != -0x80000000) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x1e,"i == INT_MIN");
  }
  builtin_strncpy(local_78,"21474836",8);
  source[0] = '4';
  source[1] = '7';
  source[2] = '\0';
  uVar1 = sscanf(local_78,"%d",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x1f,1,(ulong)uVar1);
  }
  if (p._4_4_ != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x20,"i == INT_MAX");
  }
  local_78[0] = '-';
  local_78[1] = '1';
  local_78[2] = '\0';
  uVar1 = sscanf(local_78,"%d",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x21,1,(ulong)uVar1);
  }
  if (p._4_4_ != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x22,"i == -1");
  }
  local_78[0] = '0';
  local_78[1] = '\0';
  uVar1 = sscanf(local_78,"%d",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x23,1,(ulong)uVar1);
  }
  if (p._4_4_ != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x24,"i == 0");
  }
  local_78[0] = '1';
  local_78[1] = '\0';
  uVar1 = sscanf(local_78,"%d",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x25,1,(ulong)uVar1);
  }
  if (p._4_4_ != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x26,"i == 1");
  }
  builtin_strncpy(local_78,"-2147483",8);
  builtin_strncpy(source,"648",4);
  uVar1 = sscanf(local_78,"%i",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x27,1,(ulong)uVar1);
  }
  if (p._4_4_ != -0x80000000) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x28,"i == INT_MIN");
  }
  builtin_strncpy(local_78,"21474836",8);
  source[0] = '4';
  source[1] = '7';
  source[2] = '\0';
  uVar1 = sscanf(local_78,"%i",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x29,1,(ulong)uVar1);
  }
  if (p._4_4_ != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x2a,"i == INT_MAX");
  }
  local_78[0] = '-';
  local_78[1] = '1';
  local_78[2] = '\0';
  uVar1 = sscanf(local_78,"%i",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x2b,1,(ulong)uVar1);
  }
  if (p._4_4_ != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x2c,"i == -1");
  }
  local_78[0] = '0';
  local_78[1] = '\0';
  uVar1 = sscanf(local_78,"%i",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x2d,1,(ulong)uVar1);
  }
  if (p._4_4_ != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x2e,"i == 0");
  }
  local_78[0] = '1';
  local_78[1] = '\0';
  uVar1 = sscanf(local_78,"%i",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x2f,1,(ulong)uVar1);
  }
  if (p._4_4_ != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x30,"i == 1");
  }
  builtin_strncpy(local_78,"0x7FFFFF",8);
  source[0] = 'F';
  source[1] = 'F';
  source[2] = '\0';
  uVar1 = sscanf(local_78,"%i",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x31,1,(ulong)uVar1);
  }
  if (p._4_4_ != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x32,"i == INT_MAX");
  }
  builtin_strncpy(local_78,"0x0",4);
  uVar1 = sscanf(local_78,"%i",(long)&p + 4);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x33,1,(ulong)uVar1);
  }
  if (p._4_4_ != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x34,"i == 0");
  }
  local_78[0] = '0';
  local_78[1] = '0';
  local_78[2] = '\0';
  uVar1 = sscanf(local_78,"%i%n",(long)&p + 4,&actual_rc_1);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x36,1,(ulong)uVar1);
  }
  if (p._4_4_ != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x37,"i == 0");
  }
  if (actual_rc_1 != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x38,"n == 2");
  }
  builtin_strncpy(local_78,"42949672",8);
  source[0] = '9';
  source[1] = '5';
  source[2] = '\0';
  uVar1 = sscanf(local_78,"%u",&p);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x3b,1,(ulong)uVar1);
  }
  if ((int)p != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x3c,"u == UINT_MAX");
  }
  local_78[0] = '0';
  local_78[1] = '\0';
  uVar1 = sscanf(local_78,"%u",&p);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x3d,1,(ulong)uVar1);
  }
  if ((int)p != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x3e,"u == 0");
  }
  builtin_strncpy(local_78,"fFFFFFFF",8);
  source._0_4_ = source._0_4_ & 0xffffff00;
  uVar1 = sscanf(local_78,"%x",&p);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x3f,1,(ulong)uVar1);
  }
  if ((int)p != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x40,"u == UINT_MAX");
  }
  builtin_strncpy(local_78,"7FFFFFFF",8);
  source._0_4_ = source._0_4_ & 0xffffff00;
  uVar1 = sscanf(local_78,"%x",&p);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x41,1,(ulong)uVar1);
  }
  if ((int)p != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x42,"u == INT_MAX");
  }
  local_78[0] = '0';
  local_78[1] = '\0';
  uVar1 = sscanf(local_78,"%o",&p);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x43,1,(ulong)uVar1);
  }
  if ((int)p != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x44,"u == 0");
  }
  builtin_strncpy(local_78,"37777777",8);
  builtin_strncpy(source,"777",4);
  uVar1 = sscanf(local_78,"%o",&p);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x45,1,(ulong)uVar1);
  }
  if ((int)p != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x46,"u == UINT_MAX");
  }
  memset(&u,0,100);
  local_78[0] = 'x';
  local_78[1] = '\0';
  uVar1 = sscanf(local_78,"%c",&u);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x49,1,(ulong)uVar1);
  }
  if (CONCAT11(u._1_1_,(char)u) != 0x78) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x4a,"memcmp( buffer, \"x\\0\", 2 ) == 0");
  }
  memset(&u,0,100);
  builtin_strncpy(local_78,"foo bar",8);
  uVar1 = sscanf(local_78,"%s%n",&u,&actual_rc_1);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x4e,1,(ulong)uVar1);
  }
  if (CONCAT22(u._2_2_,CONCAT11(u._1_1_,(char)u)) != 0x6f6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x4f,"memcmp( buffer, \"foo\\0\", 4 ) == 0");
  }
  if (actual_rc_1 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x50,"n == 3");
  }
  builtin_strncpy(local_78,"foo bar ",8);
  builtin_strncpy(source," baz",5);
  uVar1 = sscanf(local_78,"%s %s %n",&u,&i,&actual_rc_1);
  if (uVar1 != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x51,2,(ulong)uVar1);
  }
  if (actual_rc_1 != 9) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x52,"n == 9");
  }
  if (CONCAT44(i,CONCAT22(u._2_2_,CONCAT11(u._1_1_,(char)u))) != 0x726162006f6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x53,"memcmp( buffer, \"foo\\0bar\\0\", 8 ) == 0");
  }
  builtin_strncpy(local_78,"abcdefg",8);
  uVar1 = sscanf(local_78,"%[cba]",&u);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x56,1,(ulong)uVar1);
  }
  if (CONCAT22(u._2_2_,CONCAT11(u._1_1_,(char)u)) != 0x636261) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x57,"memcmp( buffer, \"abc\\0\", 4 ) == 0");
  }
  local_78 = (char  [8])((ulong)local_78 & 0xffffffffffffff00);
  uVar1 = sscanf(local_78,"%[cba]",&u);
  if (uVar1 != 0xffffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x59,0xffffffff,(ulong)uVar1);
  }
  local_78[0] = '3';
  local_78[1] = '\0';
  uVar1 = sscanf(local_78,"%u%[cba]",&p,&u);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x5a,1,(ulong)uVar1);
  }
  _actual_rc = 0;
  sprintf((char *)&u,"%p",0);
  _actual_rc = (long)&p + 4;
  memcpy(local_78,&u,100);
  uVar1 = sscanf(local_78,"%p",&actual_rc);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x60,1,(ulong)uVar1);
  }
  if (_actual_rc != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x61,"p == NULL");
  }
  _actual_rc = (long)&p + 4;
  sprintf((char *)&u,"%p",_actual_rc);
  _actual_rc = 0;
  memcpy(local_78,&u,100);
  uVar1 = sscanf(local_78,"%p",&actual_rc);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x65,1,(ulong)uVar1);
  }
  if (_actual_rc != (long)&p + 4) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x66,"p == &i");
  }
  local_78 = (char  [8])((ulong)local_78 & 0xffffffffffffff00);
  uVar1 = sscanf(local_78,"%d",(long)&p + 4);
  if (uVar1 != 0xffffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x68,0xffffffff,(ulong)uVar1);
  }
  builtin_strncpy(local_78,"foo",4);
  uVar1 = sscanf(local_78,"%5c",&u);
  if (uVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    fprintf((FILE *)stderr,
            "FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h (stdio/sscanf.c), line %d\n        expected %2d,        actual   %2d\n"
            ,0x69,1,(ulong)uVar1);
  }
  iVar2 = memcmp(&u,"foo",3);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x6a,"memcmp( buffer, \"foo\", 3 ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char source[100];
#include "scanf_testcases.h"
    return TEST_RESULTS;
}